

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O0

dtl_dv_t * dtl_json_load_bstr(uint8_t *pBegin,uint8_t *pEnd)

{
  undefined1 local_90 [8];
  dtl_json_reader_t reader;
  uint8_t *pResult;
  dtl_dv_t *retval;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  pResult = (uint8_t *)0x0;
  dtl_json_reader_create((dtl_json_reader_t *)local_90);
  reader.pEnd._0_1_ = 1;
  reader._96_8_ = dtl_json_reader_parse_block((dtl_json_reader_t *)local_90,pBegin,pEnd);
  if ((uint8_t *)reader._96_8_ == pEnd) {
    if (*(long *)reader._80_8_ != 0) {
      pResult = *(uint8_t **)reader._80_8_;
      dtl_dv_inc_ref(*(undefined8 *)reader._80_8_);
    }
    dtl_json_reader_destroy((dtl_json_reader_t *)local_90);
  }
  else {
    dtl_json_reader_destroy((dtl_json_reader_t *)local_90);
  }
  return (dtl_dv_t *)pResult;
}

Assistant:

dtl_dv_t* dtl_json_load_bstr(const uint8_t *pBegin, const uint8_t *pEnd)
{
   dtl_dv_t *retval = (dtl_dv_t*) 0;
   const uint8_t *pResult;
   dtl_json_reader_t reader;
   dtl_json_reader_create(&reader);
   reader.eof = true;
   pResult = dtl_json_reader_parse_block(&reader, pBegin, pEnd);
   if (pResult == (const uint8_t*) pEnd)
   {
      if (reader.data->currentElem != 0)
      {
         retval = reader.data->currentElem;
         dtl_dv_inc_ref(reader.data->currentElem);
      }
      dtl_json_reader_destroy(&reader);
   }
   else
   {
      dtl_json_reader_destroy(&reader);
   }
   return retval;
}